

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteAiger.c
# Opt level: O3

void Io_WriteAigerGz(Abc_Ntk_t *pNtk,char *pFileName,int fWriteSymbols)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  long *plVar4;
  long lVar5;
  long *plVar6;
  bool bVar7;
  uint uVar8;
  gzFile file;
  Abc_Obj_t *pAVar9;
  void *buf;
  ProgressBar *p;
  Vec_Ptr_t *pVVar10;
  char *pcVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  int *piVar15;
  byte *pbVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  char *format;
  size_t __size;
  ulong uVar21;
  int local_48;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteAiger.c"
                  ,0x1bd,"void Io_WriteAigerGz(Abc_Ntk_t *, char *, int)");
  }
  file = gzopen(pFileName,"wb");
  if (file == (gzFile)0x0) {
    fprintf(_stdout,"Io_WriteAigerGz(): Cannot open the output file \"%s\".\n",pFileName);
    return;
  }
  iVar1 = pNtk->nConstrs;
  pAVar9 = Abc_AigConst1(pNtk);
  (pAVar9->field_6).pTemp = (void *)0x0;
  pVVar10 = pNtk->vCis;
  if (pVVar10->nSize < 1) {
    uVar21 = 1;
  }
  else {
    uVar19 = 1;
    do {
      *(ulong *)((long)pVVar10->pArray[uVar19 - 1] + 0x40) = uVar19;
      uVar21 = uVar19 + 1;
      pVVar10 = pNtk->vCis;
      bVar7 = (long)uVar19 < (long)pVVar10->nSize;
      uVar19 = uVar21;
    } while (bVar7);
  }
  pVVar10 = pNtk->vObjs;
  if (0 < pVVar10->nSize) {
    lVar13 = 0;
    do {
      puVar3 = (undefined8 *)pVVar10->pArray[lVar13];
      if (puVar3 != (undefined8 *)0x0) {
        if (((ulong)puVar3 & 1) != 0) goto LAB_002d81df;
        if (*(int *)*puVar3 != 3) goto LAB_002d81d6;
        if (*(int *)((long)puVar3 + 0x1c) == 2) {
          uVar19 = uVar21 & 0xffffffff;
          uVar21 = (ulong)((int)uVar21 + 1);
          puVar3[8] = uVar19;
          pVVar10 = pNtk->vObjs;
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar10->nSize);
  }
  uVar18 = pNtk->vPis->nSize;
  uVar12 = pNtk->nObjCounts[8];
  iVar2 = pNtk->nObjCounts[7];
  uVar21 = (ulong)(uVar12 + iVar2 + uVar18);
  if (iVar1 == 0) {
    gzprintf(file,"aig %u %u %u %u %u",uVar21,(ulong)uVar18,(ulong)uVar12,
             (ulong)(uint)pNtk->vPos->nSize,iVar2);
  }
  else {
    gzprintf(file,"aig %u %u %u %u %u",uVar21,(ulong)uVar18,(ulong)uVar12,0,iVar2);
    gzprintf(file," %u %u",(ulong)(uint)(pNtk->vPos->nSize - pNtk->nConstrs));
  }
  gzprintf(file,"\n");
  Abc_NtkInvertConstraints(pNtk);
  pVVar10 = pNtk->vBoxes;
  if (0 < pVVar10->nSize) {
    lVar13 = 0;
    do {
      plVar4 = (long *)pVVar10->pArray[lVar13];
      if ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 8) {
        lVar5 = *(long *)(*(long *)(*plVar4 + 0x20) + 8);
        plVar6 = *(long **)(lVar5 + (long)*(int *)plVar4[4] * 8);
        iVar2 = *(int *)(*(long *)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                  (long)*(int *)plVar6[4] * 8) + 0x40);
        if (3 < (ulong)plVar4[7]) {
          __assert_fail("Abc_LatchIsInitNone(pLatch) || Abc_LatchIsInitDc(pLatch)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteAiger.c"
                        ,0x1ee,"void Io_WriteAigerGz(Abc_Ntk_t *, char *, int)");
        }
        uVar21 = (ulong)(((uint)(iVar2 == 0) ^ *(uint *)((long)plVar6 + 0x14) >> 10 & 1) + iVar2 * 2
                        );
        switch(plVar4[7]) {
        default:
          gzprintf(file,"%u %u\n",uVar21,
                   (ulong)(uint)(*(int *)(*(long *)(lVar5 + (long)*(int *)plVar4[6] * 8) + 0x40) * 2
                                ));
          goto LAB_002d7db6;
        case 1:
          pcVar11 = "%u\n";
          break;
        case 2:
          pcVar11 = "%u 1\n";
        }
        gzprintf(file,pcVar11,uVar21);
      }
LAB_002d7db6:
      lVar13 = lVar13 + 1;
      pVVar10 = pNtk->vBoxes;
    } while (lVar13 < pVVar10->nSize);
  }
  pVVar10 = pNtk->vPos;
  if (0 < pVVar10->nSize) {
    lVar13 = 0;
    do {
      plVar4 = (long *)pVVar10->pArray[lVar13];
      iVar2 = *(int *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                (long)*(int *)plVar4[4] * 8) + 0x40);
      gzprintf(file,"%u\n",
               (ulong)(((uint)(iVar2 == 0) ^ *(uint *)((long)plVar4 + 0x14) >> 10 & 1) + iVar2 * 2))
      ;
      lVar13 = lVar13 + 1;
      pVVar10 = pNtk->vPos;
    } while (lVar13 < pVVar10->nSize);
  }
  Abc_NtkInvertConstraints(pNtk);
  iVar2 = pNtk->nObjCounts[7];
  __size = (long)iVar2 * 6 + 100;
  buf = malloc(__size);
  p = Extra_ProgressBarStart((FILE *)_stdout,pNtk->vObjs->nSize);
  pVVar10 = pNtk->vObjs;
  if (pVVar10->nSize < 1) {
    uVar18 = 0;
  }
  else {
    lVar13 = 0;
    uVar18 = 0;
    do {
      puVar3 = (undefined8 *)pVVar10->pArray[lVar13];
      if (puVar3 != (undefined8 *)0x0) {
        if (((ulong)puVar3 & 1) != 0) goto LAB_002d81df;
        piVar15 = (int *)*puVar3;
        if (*piVar15 != 3) goto LAB_002d81d6;
        if (*(int *)((long)puVar3 + 0x1c) == 2) {
          if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= lVar13)) {
            Extra_ProgressBarUpdate_int(p,(int)lVar13,(char *)0x0);
            piVar15 = (int *)*puVar3;
          }
          uVar12 = (*(uint *)((long)puVar3 + 0x14) >> 10 & 1) +
                   *(int *)(*(long *)(*(long *)(*(long *)(piVar15 + 8) + 8) +
                                     (long)*(int *)puVar3[4] * 8) + 0x40) * 2;
          uVar8 = (*(uint *)((long)puVar3 + 0x14) >> 0xb & 1) +
                  *(int *)(*(long *)(*(long *)(*(long *)(piVar15 + 8) + 8) +
                                    (long)((int *)puVar3[4])[1] * 8) + 0x40) * 2;
          uVar14 = uVar8;
          if (uVar12 < uVar8) {
            uVar14 = uVar12;
          }
          if (uVar8 < uVar12) {
            uVar8 = uVar12;
          }
          uVar12 = *(int *)(puVar3 + 8) * 2 - uVar8;
          if ((uint)(*(int *)(puVar3 + 8) * 2) < uVar8 || uVar12 == 0) {
            __assert_fail("uLit1 < uLit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteAiger.c"
                          ,0x20b,"void Io_WriteAigerGz(Abc_Ntk_t *, char *, int)");
          }
          if (0x7f < uVar12) {
            pbVar16 = (byte *)((long)(int)uVar18 + (long)buf);
            uVar20 = uVar12;
            do {
              *pbVar16 = (byte)uVar20 | 0x80;
              uVar12 = uVar20 >> 7;
              pbVar16 = pbVar16 + 1;
              uVar18 = uVar18 + 1;
              bVar7 = 0x3fff < uVar20;
              uVar20 = uVar12;
            } while (bVar7);
          }
          iVar17 = uVar18 + 1;
          *(char *)((long)buf + (long)(int)uVar18) = (char)uVar12;
          uVar8 = uVar8 - uVar14;
          if (0x7f < uVar8) {
            pbVar16 = (byte *)((long)iVar17 + (long)buf);
            uVar18 = uVar8;
            do {
              *pbVar16 = (byte)uVar18 | 0x80;
              uVar8 = uVar18 >> 7;
              pbVar16 = pbVar16 + 1;
              iVar17 = iVar17 + 1;
              bVar7 = 0x3fff < uVar18;
              uVar18 = uVar8;
            } while (bVar7);
          }
          *(char *)((long)buf + (long)iVar17) = (char)uVar8;
          if (iVar2 * 6 + 0x5a <= iVar17) {
            puts(
                "Io_WriteAiger(): AIGER generation has failed because the allocated buffer is too small."
                );
            goto LAB_002d81b2;
          }
          uVar18 = iVar17 + 1;
          pVVar10 = pNtk->vObjs;
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar10->nSize);
  }
  local_48 = (int)__size;
  if (local_48 <= (int)uVar18) {
    __assert_fail("Pos < nBufferSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteAiger.c"
                  ,0x215,"void Io_WriteAigerGz(Abc_Ntk_t *, char *, int)");
  }
  Extra_ProgressBarStop(p);
  gzwrite(file,buf,uVar18);
  if (buf != (void *)0x0) {
    free(buf);
  }
  if (fWriteSymbols != 0) {
    pVVar10 = pNtk->vPis;
    if (0 < pVVar10->nSize) {
      uVar21 = 0;
      do {
        pcVar11 = Abc_ObjName((Abc_Obj_t *)pVVar10->pArray[uVar21]);
        gzprintf(file,"i%d %s\n",uVar21 & 0xffffffff,pcVar11);
        uVar21 = uVar21 + 1;
        pVVar10 = pNtk->vPis;
      } while ((long)uVar21 < (long)pVVar10->nSize);
    }
    pVVar10 = pNtk->vBoxes;
    if (0 < pVVar10->nSize) {
      uVar21 = 0;
      do {
        plVar4 = (long *)pVVar10->pArray[uVar21];
        if ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 8) {
          pcVar11 = Abc_ObjName(*(Abc_Obj_t **)
                                 (*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                 (long)*(int *)plVar4[6] * 8));
          gzprintf(file,"l%d %s\n",uVar21 & 0xffffffff,pcVar11);
          pVVar10 = pNtk->vBoxes;
        }
        uVar21 = uVar21 + 1;
      } while ((long)uVar21 < (long)pVVar10->nSize);
    }
    pVVar10 = pNtk->vPos;
    uVar21 = (ulong)(uint)pVVar10->nSize;
    if (0 < pVVar10->nSize) {
      uVar19 = 0;
      do {
        pAVar9 = (Abc_Obj_t *)pVVar10->pArray[uVar19];
        if (iVar1 == 0) {
          pcVar11 = Abc_ObjName(pAVar9);
          format = "o%d %s\n";
LAB_002d811d:
          uVar21 = uVar19 & 0xffffffff;
        }
        else {
          iVar2 = pNtk->nConstrs;
          if ((long)uVar19 < (long)((int)uVar21 - iVar2)) {
            pcVar11 = Abc_ObjName(pAVar9);
            format = "b%d %s\n";
            goto LAB_002d811d;
          }
          pcVar11 = Abc_ObjName(pAVar9);
          format = "c%d %s\n";
          uVar21 = (ulong)(uint)((iVar2 - (int)uVar21) + (int)uVar19);
        }
        gzprintf(file,format,uVar21,pcVar11);
        uVar19 = uVar19 + 1;
        pVVar10 = pNtk->vPos;
        uVar21 = (ulong)pVVar10->nSize;
      } while ((long)uVar19 < (long)uVar21);
    }
  }
  gzprintf(file,"c\n");
  if ((pNtk->pName != (char *)0x0) && (*pNtk->pName != '\0')) {
    gzprintf(file,".model %s\n");
  }
  pcVar11 = Extra_TimeStamp();
  gzprintf(file,"This file was produced by ABC on %s\n",pcVar11);
  gzprintf(file,"For information about AIGER format, refer to %s\n","http://fmv.jku.at/aiger");
LAB_002d81b2:
  gzclose(file);
  return;
LAB_002d81df:
  pcVar11 = "!Abc_ObjIsComplement(pNode)";
  goto LAB_002d81e6;
LAB_002d81d6:
  pcVar11 = "Abc_NtkIsStrash(pNode->pNtk)";
LAB_002d81e6:
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                ,0x18e,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
}

Assistant:

void Io_WriteAigerGz( Abc_Ntk_t * pNtk, char * pFileName, int fWriteSymbols )
{
    ProgressBar * pProgress;
    gzFile pFile;
    Abc_Obj_t * pObj, * pDriver, * pLatch;
    int i, nNodes, Pos, nBufferSize, fExtended;
    unsigned char * pBuffer;
    unsigned uLit0, uLit1, uLit;

    assert( Abc_NtkIsStrash(pNtk) );
    // start the output stream
    pFile = gzopen( pFileName, "wb" ); // if pFileName doesn't end in ".gz" then this acts as a passthrough to fopen
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteAigerGz(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }

    fExtended = Abc_NtkConstrNum(pNtk);

    // set the node numbers to be used in the output file
    nNodes = 0;
    Io_ObjSetAigerNum( Abc_AigConst1(pNtk), nNodes++ );
    Abc_NtkForEachCi( pNtk, pObj, i )
        Io_ObjSetAigerNum( pObj, nNodes++ );
    Abc_AigForEachAnd( pNtk, pObj, i )
        Io_ObjSetAigerNum( pObj, nNodes++ );

    // write the header "M I L O A" where M = I + L + A
    gzprintf( pFile, "aig %u %u %u %u %u", 
              Abc_NtkPiNum(pNtk) + Abc_NtkLatchNum(pNtk) + Abc_NtkNodeNum(pNtk), 
              Abc_NtkPiNum(pNtk),
              Abc_NtkLatchNum(pNtk),
              fExtended ? 0 : Abc_NtkPoNum(pNtk),
              Abc_NtkNodeNum(pNtk) );
    // write the extended header "B C J F"
    if ( fExtended )
        gzprintf( pFile, " %u %u", Abc_NtkPoNum(pNtk) - Abc_NtkConstrNum(pNtk), Abc_NtkConstrNum(pNtk) );
    gzprintf( pFile, "\n" ); 

    // if the driver node is a constant, we need to complement the literal below
    // because, in the AIGER format, literal 0/1 is represented as number 0/1
    // while, in ABC, constant 1 node has number 0 and so literal 0/1 will be 1/0

    // write latch drivers
    Abc_NtkInvertConstraints( pNtk );
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        pObj = Abc_ObjFanin0(pLatch);
        pDriver = Abc_ObjFanin0(pObj);
        uLit = Io_ObjMakeLit( Io_ObjAigerNum(pDriver), Abc_ObjFaninC0(pObj) ^ (Io_ObjAigerNum(pDriver) == 0) );
        if ( Abc_LatchIsInit0(pLatch) )
            gzprintf( pFile, "%u\n", uLit );
        else if ( Abc_LatchIsInit1(pLatch) )
            gzprintf( pFile, "%u 1\n", uLit );
        else
        {
            // Both None and DC are written as 'uninitialized' e.g. a free boolean value
            assert( Abc_LatchIsInitNone(pLatch) || Abc_LatchIsInitDc(pLatch) );
            gzprintf( pFile, "%u %u\n", uLit, Io_ObjMakeLit( Io_ObjAigerNum(Abc_ObjFanout0(pLatch)), 0 ) );
        }
    }
    // write PO drivers
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        pDriver = Abc_ObjFanin0(pObj);
        gzprintf( pFile, "%u\n", Io_ObjMakeLit( Io_ObjAigerNum(pDriver), Abc_ObjFaninC0(pObj) ^ (Io_ObjAigerNum(pDriver) == 0) ) );
    }
    Abc_NtkInvertConstraints( pNtk );

    // write the nodes into the buffer
    Pos = 0;
    nBufferSize = 6 * Abc_NtkNodeNum(pNtk) + 100; // skeptically assuming 3 chars per one AIG edge
    pBuffer = ABC_ALLOC( unsigned char, nBufferSize );
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkObjNumMax(pNtk) );
    Abc_AigForEachAnd( pNtk, pObj, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        uLit  = Io_ObjMakeLit( Io_ObjAigerNum(pObj), 0 );
        uLit0 = Io_ObjMakeLit( Io_ObjAigerNum(Abc_ObjFanin0(pObj)), Abc_ObjFaninC0(pObj) );
        uLit1 = Io_ObjMakeLit( Io_ObjAigerNum(Abc_ObjFanin1(pObj)), Abc_ObjFaninC1(pObj) );
        if ( uLit0 > uLit1 )
        {
            unsigned Temp = uLit0;
            uLit0 = uLit1;
            uLit1 = Temp;
        }
        assert( uLit1 < uLit );
        Pos = Io_WriteAigerEncode( pBuffer, Pos, uLit  - uLit1 );
        Pos = Io_WriteAigerEncode( pBuffer, Pos, uLit1 - uLit0 );
        if ( Pos > nBufferSize - 10 )
        {
            printf( "Io_WriteAiger(): AIGER generation has failed because the allocated buffer is too small.\n" );
	        gzclose( pFile );
            return;
        }
    }
    assert( Pos < nBufferSize );
    Extra_ProgressBarStop( pProgress );

    // write the buffer
    gzwrite(pFile, pBuffer, Pos);
    ABC_FREE( pBuffer );

    // write the symbol table
    if ( fWriteSymbols )
    {
        // write PIs
        Abc_NtkForEachPi( pNtk, pObj, i )
            gzprintf( pFile, "i%d %s\n", i, Abc_ObjName(pObj) );
        // write latches
        Abc_NtkForEachLatch( pNtk, pObj, i )
            gzprintf( pFile, "l%d %s\n", i, Abc_ObjName(Abc_ObjFanout0(pObj)) );
        // write POs
        Abc_NtkForEachPo( pNtk, pObj, i )
            if ( !fExtended )
                gzprintf( pFile, "o%d %s\n", i, Abc_ObjName(pObj) );
            else if ( i < Abc_NtkPoNum(pNtk) - Abc_NtkConstrNum(pNtk) )
                gzprintf( pFile, "b%d %s\n", i, Abc_ObjName(pObj) );
            else
                gzprintf( pFile, "c%d %s\n", i - (Abc_NtkPoNum(pNtk) - Abc_NtkConstrNum(pNtk)), Abc_ObjName(pObj) );
    }

    // write the comment
    gzprintf( pFile, "c\n" );
    if ( pNtk->pName && strlen(pNtk->pName) > 0 )
        gzprintf( pFile, ".model %s\n", pNtk->pName );
    gzprintf( pFile, "This file was produced by ABC on %s\n", Extra_TimeStamp() );
    gzprintf( pFile, "For information about AIGER format, refer to %s\n", "http://fmv.jku.at/aiger" );
	gzclose( pFile );
}